

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::AddGalacticPars(CEExecOptions *this)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"l,glon",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Galactic longitude (degrees)",&local_52);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_30,&local_50,0.0);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::~string((string *)&local_30);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"b,glat",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Galactic latitude (degrees)",&local_52);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_30,&local_50,0.0);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_52);
  std::__cxx11::string::~string((string *)&local_30);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  return;
}

Assistant:

inline
void CEExecOptions::AddGalacticPars(void)
{
    AddDoubleParam("l,glon", "Galactic longitude (degrees)", 0.0);
    AddDoubleParam("b,glat", "Galactic latitude (degrees)", 0.0);
}